

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O0

void __thiscall
TPZGaussRule::ComputingGaussJacobiQuadrature
          (TPZGaussRule *this,int *npoints,longdouble alpha,longdouble beta,
          TPZVec<long_double> *Location,TPZVec<long_double> *Weight)

{
  int iVar1;
  longdouble *plVar2;
  TPZVec<long_double> *in_RCX;
  TPZVec<long_double> *in_RDX;
  int *in_RSI;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar11;
  longdouble in_ST4;
  longdouble in_ST5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double dVar12;
  double extraout_XMM0_Qa_04;
  double in_XMM1_Qa;
  longdouble in_stack_00000008;
  longdouble in_stack_00000018;
  int itera_max;
  int itera;
  longdouble precision;
  longdouble d;
  longdouble x0;
  longdouble temp;
  longdouble r3;
  longdouble r2;
  longdouble r1;
  longdouble prod;
  longdouble p1;
  int i;
  longdouble dp2;
  longdouble delta;
  longdouble cc;
  TPZVec<long_double> c;
  TPZVec<long_double> b;
  longdouble bn;
  longdouble an;
  undefined2 uVar13;
  undefined6 in_stack_fffffffffffffb72;
  undefined2 in_stack_fffffffffffffb90;
  undefined6 in_stack_fffffffffffffb92;
  int64_t in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  undefined4 uVar14;
  undefined6 uStack_458;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  undefined6 in_stack_fffffffffffffbe8;
  undefined6 uVar15;
  undefined2 in_stack_fffffffffffffbee;
  TPZVec<long_double> *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  undefined6 in_stack_fffffffffffffc00;
  undefined2 in_stack_fffffffffffffc06;
  undefined2 in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  undefined2 in_stack_fffffffffffffc18;
  undefined8 local_3dc;
  undefined2 in_stack_fffffffffffffc2c;
  undefined2 in_stack_fffffffffffffc2e;
  longdouble *in_stack_fffffffffffffc30;
  undefined2 in_stack_fffffffffffffc38;
  undefined4 local_3c4;
  undefined6 in_stack_fffffffffffffc40;
  undefined2 in_stack_fffffffffffffc46;
  int local_1cc;
  longdouble local_188;
  longdouble local_178;
  longdouble local_168;
  longdouble local_158;
  longdouble local_148;
  longdouble local_138;
  longdouble local_128;
  longdouble local_118;
  longdouble local_108;
  int local_ec;
  longdouble local_e8;
  longdouble local_d8;
  longdouble local_c8;
  TPZVec<long_double> local_a8;
  TPZVec<long_double> local_88;
  longdouble local_68;
  longdouble local_58;
  TPZVec<long_double> *local_48;
  TPZVec<long_double> *local_40;
  longdouble local_38;
  longdouble local_28;
  int *local_10;
  
  local_28 = in_stack_00000008;
  local_38 = in_stack_00000018;
  local_48 = in_RCX;
  local_40 = in_RDX;
  local_10 = in_RSI;
  TPZVec<long_double>::TPZVec(&local_88);
  TPZVec<long_double>::TPZVec(&local_a8);
  local_178 = (longdouble)0;
  local_168 = local_178;
  (*local_40->_vptr_TPZVec[2])(local_40,(long)*local_10,&local_178);
  local_188 = (longdouble)0;
  (*local_48->_vptr_TPZVec[2])(local_48,(long)*local_10,&local_188);
  TPZVec<long_double>::Resize
            ((TPZVec<long_double> *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             in_stack_fffffffffffffb98,
             (longdouble *)CONCAT62(in_stack_fffffffffffffb92,in_stack_fffffffffffffb90));
  TPZVec<long_double>::Resize
            ((TPZVec<long_double> *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             in_stack_fffffffffffffb98,
             (longdouble *)CONCAT62(in_stack_fffffffffffffb92,in_stack_fffffffffffffb90));
  if (local_28 <= -(longdouble)1) {
    std::operator<<((ostream *)&std::cerr,
                    "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < ALPHA is required.\n");
    exit(1);
  }
  if (local_38 <= -(longdouble)1) {
    std::operator<<((ostream *)&std::cerr,
                    "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < BETA is required.\n");
    exit(1);
  }
  local_ec = 1;
  dVar12 = extraout_XMM0_Qa;
  do {
    if (*local_10 < local_ec) {
      lVar4 = in_ST5;
      dVar12 = gamma(dVar12);
      lVar3 = lVar4;
      dVar12 = gamma(dVar12);
      lVar5 = lVar3;
      dVar12 = gamma(dVar12);
      local_d8 = (in_ST1 * in_ST0) / in_ST2;
      local_118 = (longdouble)1;
      for (local_ec = 2; lVar7 = local_d8, lVar6 = local_118, local_ec <= *local_10;
          local_ec = local_ec + 1) {
        plVar2 = TPZVec<long_double>::operator[](&local_a8,(long)(local_ec + -1));
        local_118 = *plVar2 * lVar6;
        dVar12 = extraout_XMM0_Qa_04;
      }
      uVar13 = (undefined2)((unkuint10)(longdouble)2.0 >> 0x40);
      lVar6 = lVar5;
      std::pow(dVar12,in_XMM1_Qa);
      local_c8 = local_118 * in_ST3 * lVar7;
      local_ec = 1;
      do {
        lVar7 = local_168;
        if (*local_10 < local_ec) {
          for (local_ec = 1; local_ec <= *local_10 / 2; local_ec = local_ec + 1) {
            plVar2 = TPZVec<long_double>::operator[](local_40,(long)(local_ec + -1));
            local_158 = *plVar2;
            plVar2 = TPZVec<long_double>::operator[](local_40,(long)(*local_10 - local_ec));
            uVar14 = SUB104(*plVar2,0);
            uVar15 = (undefined6)((unkuint10)*plVar2 >> 0x20);
            plVar2 = TPZVec<long_double>::operator[](local_40,(long)(local_ec + -1));
            *plVar2 = (longdouble)CONCAT64(uVar15,uVar14);
            uVar14 = SUB104(local_158,0);
            uVar15 = (undefined6)((unkuint10)local_158 >> 0x20);
            plVar2 = TPZVec<long_double>::operator[](local_40,(long)(*local_10 - local_ec));
            *plVar2 = (longdouble)CONCAT64(uVar15,uVar14);
          }
          for (local_ec = 1; local_ec <= *local_10 / 2; local_ec = local_ec + 1) {
            plVar2 = TPZVec<long_double>::operator[](local_48,(long)(local_ec + -1));
            local_158 = *plVar2;
            plVar2 = TPZVec<long_double>::operator[](local_48,(long)(*local_10 - local_ec));
            lVar3 = *plVar2;
            plVar2 = TPZVec<long_double>::operator[](local_48,(long)(local_ec + -1));
            *plVar2 = lVar3;
            uVar14 = SUB104(local_158,0);
            uStack_458 = (undefined6)((unkuint10)local_158 >> 0x20);
            plVar2 = TPZVec<long_double>::operator[](local_48,(long)(*local_10 - local_ec));
            *plVar2 = (longdouble)CONCAT64(uStack_458,uVar14);
          }
          TPZVec<long_double>::~TPZVec
                    ((TPZVec<long_double> *)CONCAT62(in_stack_fffffffffffffb72,uVar13));
          TPZVec<long_double>::~TPZVec
                    ((TPZVec<long_double> *)CONCAT62(in_stack_fffffffffffffb72,uVar13));
          return;
        }
        lVar8 = in_ST5;
        lVar9 = in_ST4;
        lVar10 = lVar4;
        lVar11 = lVar4;
        if (local_ec == 1) {
          local_58 = local_28 / (longdouble)*local_10;
          local_68 = local_38 / (longdouble)*local_10;
          iVar1 = *local_10;
          local_128 = ((_DAT_02043f20 * local_58) / (longdouble)iVar1 +
                      _DAT_02043f10 / ((longdouble)4.0 + (longdouble)(iVar1 * iVar1))) *
                      (local_28 + (longdouble)1);
          local_138 = local_68 * _DAT_02043f60 * local_58 +
                      _DAT_02043f50 * local_58 * local_58 +
                      _DAT_02043f40 * local_68 + _DAT_02043f30 * local_58 + (longdouble)1;
          local_168 = (local_138 - local_128) / local_138;
          lVar3 = lVar4;
          lVar6 = lVar4;
        }
        else if (local_ec == 2) {
          lVar3 = (longdouble)1;
          local_128 = (_DAT_02043ec0 + local_28) /
                      ((_DAT_02043ed0 * local_28 + lVar3) * (local_28 + lVar3));
          local_138 = ((_DAT_02043ef0 * local_28 + lVar3) *
                      _DAT_02043ee0 * ((longdouble)-8.0 + (longdouble)*local_10)) /
                      (longdouble)*local_10 + lVar3;
          local_148 = (((longdouble)0.25 * ABS(local_28) + lVar3) * _DAT_02043f00 * local_38) /
                      (longdouble)*local_10 + lVar3;
          local_168 = local_168 - (lVar3 - local_168) * local_148 * local_138 * local_128;
          lVar3 = lVar4;
          lVar6 = lVar4;
        }
        else if (local_ec == 3) {
          local_148 = (longdouble)1;
          local_128 = (_DAT_02043e40 + _DAT_02043e30 * local_28) /
                      (_DAT_02043e20 * local_28 + local_148);
          local_138 = (_DAT_02043e50 * ((longdouble)*local_10 - (longdouble)8.0)) /
                      (longdouble)*local_10 + local_148;
          local_148 = ((longdouble)8.0 * local_38) /
                      ((longdouble)(*local_10 * *local_10) * (_DAT_02043e60 + local_38)) + local_148
          ;
          lVar3 = local_148 * local_138 * local_128;
          plVar2 = TPZVec<long_double>::operator[](local_40,0);
          local_168 = lVar7 - (*plVar2 - local_168) * lVar3;
          lVar9 = in_ST4;
          lVar8 = in_ST5;
          lVar10 = lVar4;
          lVar3 = lVar11;
          lVar6 = lVar11;
        }
        else if (local_ec < *local_10 + -1) {
          plVar2 = TPZVec<long_double>::operator[](local_40,(long)(local_ec + -2));
          lVar7 = *plVar2;
          plVar2 = TPZVec<long_double>::operator[](local_40,(long)(local_ec + -3));
          lVar8 = *plVar2;
          lVar6 = lVar5;
          plVar2 = TPZVec<long_double>::operator[](local_40,(long)(local_ec + -4));
          local_168 = *plVar2 + ((longdouble)3.0 * lVar7 - lVar8 * (longdouble)3.0);
          lVar9 = in_ST4;
          lVar8 = in_ST5;
          lVar10 = lVar4;
          lVar11 = lVar3;
          lVar3 = lVar5;
        }
        else if (local_ec == *local_10 + -1) {
          local_148 = (longdouble)1;
          local_128 = (_DAT_02043e70 * local_38 + local_148) /
                      (_DAT_02043e90 + _DAT_02043e80 * local_38);
          local_138 = local_148 /
                      ((_DAT_02043ea0 * ((longdouble)-4.0 + (longdouble)*local_10)) /
                       (_DAT_02043eb0 * ((longdouble)-4.0 + (longdouble)*local_10) + local_148) +
                      local_148);
          local_148 = local_148 /
                      (((longdouble)20.0 * local_28) /
                       ((longdouble)(*local_10 * *local_10) * ((longdouble)7.5 + local_28)) +
                      local_148);
          lVar5 = local_148 * local_138 * local_128;
          plVar2 = TPZVec<long_double>::operator[](local_40,(long)(local_ec + -3));
          local_168 = (lVar7 - *plVar2) * lVar5 + lVar7;
          lVar9 = in_ST4;
          lVar8 = in_ST5;
          lVar10 = lVar4;
          lVar11 = lVar3;
          lVar6 = lVar3;
        }
        else {
          lVar11 = lVar3;
          lVar3 = lVar5;
          if (local_ec == *local_10) {
            local_148 = (longdouble)1;
            local_128 = (_DAT_02043e20 * local_38 + local_148) /
                        (_DAT_02043e40 + _DAT_02043e30 * local_38);
            local_138 = local_148 /
                        ((_DAT_02043e50 * ((longdouble)*local_10 - (longdouble)8.0)) /
                         (longdouble)*local_10 + local_148);
            local_148 = local_148 /
                        (((longdouble)8.0 * local_28) /
                         ((longdouble)(*local_10 * *local_10) * (_DAT_02043e60 + local_28)) +
                        local_148);
            lVar5 = local_148 * local_138 * local_128;
            lVar3 = lVar4;
            plVar2 = TPZVec<long_double>::operator[](local_40,(long)(local_ec + -3));
            local_168 = (lVar7 - *plVar2) * lVar5 + lVar7;
            lVar9 = in_ST4;
            lVar8 = in_ST5;
            lVar10 = lVar4;
            lVar11 = lVar3;
            lVar6 = lVar3;
          }
        }
        lVar4 = lVar11;
        in_ST5 = lVar10;
        machinePrecision();
        for (local_1cc = 1; in_ST4 = lVar8, lVar5 = lVar6, local_1cc < 0xb;
            local_1cc = local_1cc + 1) {
          uVar13 = (undefined2)((unkuint10)local_168 >> 0x40);
          in_ST4 = in_ST5;
          in_ST5 = lVar4;
          lVar4 = lVar3;
          lVar3 = lVar6;
          JacobiPolinomial((TPZGaussRule *)
                           CONCAT26(in_stack_fffffffffffffc46,in_stack_fffffffffffffc40),
                           (longdouble)CONCAT28(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30)
                           ,CONCAT22(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc2c),
                           (longdouble)CONCAT28(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10)
                           ,(longdouble)
                            CONCAT28(in_stack_fffffffffffffc08,
                                     CONCAT26(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)),
                           (TPZVec<long_double> *)
                           CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                           in_stack_fffffffffffffbf0,
                           (longdouble *)
                           CONCAT26(in_stack_fffffffffffffbee,in_stack_fffffffffffffbe8),
                           (longdouble *)
                           CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
          local_168 = local_168 - lVar8 / local_e8;
          lVar5 = lVar3;
          if (ABS(lVar8 / local_e8) <= ((longdouble)1 + ABS(local_168)) * lVar9) break;
          lVar8 = in_ST4;
          lVar6 = lVar3;
        }
        local_3c4 = SUB104(local_168,0);
        in_stack_fffffffffffffc40 = (undefined6)((unkuint10)local_168 >> 0x20);
        plVar2 = TPZVec<long_double>::operator[](local_40,(long)(local_ec + -1));
        *plVar2 = (longdouble)CONCAT64(in_stack_fffffffffffffc40,local_3c4);
        lVar6 = local_c8 / (local_108 * local_e8);
        local_3dc = SUB108(lVar6,0);
        in_stack_fffffffffffffc2c = (undefined2)((unkuint10)lVar6 >> 0x40);
        lVar6 = lVar5;
        in_stack_fffffffffffffc30 = TPZVec<long_double>::operator[](local_48,(long)(local_ec + -1));
        *in_stack_fffffffffffffc30 = (longdouble)CONCAT28(in_stack_fffffffffffffc2c,local_3dc);
        local_ec = local_ec + 1;
      } while( true );
    }
    if ((local_38 + local_28 != (longdouble)0) || (NAN(local_38 + local_28) || NAN((longdouble)0)))
    {
      if ((local_38 - local_28 == (longdouble)0) &&
         (!NAN(local_38 - local_28) && !NAN((longdouble)0))) goto LAB_0114047d;
      lVar3 = local_28 + local_38;
      lVar5 = local_38 - local_28;
      lVar4 = (longdouble)local_ec + (longdouble)local_ec;
      in_ST3 = in_ST2;
      in_ST4 = in_ST2;
      in_ST5 = in_ST2;
      plVar2 = TPZVec<long_double>::operator[](&local_88,(long)(local_ec + -1));
      *plVar2 = (lVar5 * lVar3) / ((lVar3 + (longdouble)-2.0 + lVar4) * (lVar4 + lVar3));
      dVar12 = extraout_XMM0_Qa_01;
    }
    else {
LAB_0114047d:
      plVar2 = TPZVec<long_double>::operator[](&local_88,(long)(local_ec + -1));
      *plVar2 = (longdouble)0;
      dVar12 = extraout_XMM0_Qa_00;
    }
    if (local_ec == 1) {
      plVar2 = TPZVec<long_double>::operator[](&local_a8,0);
      *plVar2 = (longdouble)0;
      lVar3 = in_ST0;
      dVar12 = extraout_XMM0_Qa_02;
    }
    else {
      lVar4 = (longdouble)local_ec;
      lVar5 = lVar4 + -(longdouble)1;
      lVar6 = local_28 + lVar5;
      lVar7 = local_38 + lVar5;
      lVar9 = local_38 + local_28;
      lVar3 = in_ST0;
      in_ST1 = in_ST0;
      in_ST2 = in_ST0;
      std::pow(dVar12,in_XMM1_Qa);
      lVar10 = local_38 + local_28;
      lVar8 = (longdouble)local_ec;
      in_ST3 = in_ST2;
      in_ST4 = in_ST2;
      in_ST5 = in_ST2;
      plVar2 = TPZVec<long_double>::operator[](&local_a8,(long)(local_ec + -1));
      *plVar2 = (lVar7 * lVar6 * (longdouble)4.0 * lVar5 * (lVar5 + lVar9)) /
                (((longdouble)-3.0 + lVar8 + lVar8 + lVar10) *
                in_ST0 * (-(longdouble)1 + lVar4 + lVar4 + lVar9));
      dVar12 = extraout_XMM0_Qa_03;
    }
    local_ec = local_ec + 1;
    in_ST0 = lVar3;
  } while( true );
}

Assistant:

void TPZGaussRule::ComputingGaussJacobiQuadrature(int *npoints,long double alpha, long double beta,TPZVec<long double> &Location,TPZVec<long double> &Weight) {
	// Computing number of points appropriated to the wished order = 2*npoints - 1. Note: If odd we need increment one point more
	long double an, bn;
	TPZVec<long double> b;
	TPZVec<long double> c;
	long double cc, delta, dp2;
	int i;
	long double p1, prod, r1, r2, r3, temp, x0 = 0.0;
	
	Location.Resize((*npoints),0.0L);
	Weight.Resize((*npoints),0.0L);
	
	b.Resize((*npoints),0.0L);
	c.Resize((*npoints),0.0L);
	
	//  This method permit only alpha > -1.0 and beta > -1.0
	if(alpha <= -1.0L) {
		std::cerr << "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < ALPHA is required.\n";
		std::exit ( 1 );
	}
	if(beta <= -1.0L) {
		std::cerr << "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < BETA is required.\n";
		std::exit ( 1 );
	}
	
	//  Set the recursion coefficients.
	for(i=1;i<=(*npoints);i++) {
		if(alpha + beta == 0.0L || beta - alpha == 0.0L) {
			b[i-1] = 0.0L;
		}
		else {
			b[i-1] = ( alpha + beta ) * ( beta - alpha ) / 
			( ( alpha + beta + ( 2.0L * ((long double)(i)) ) ) 
             * ( alpha + beta + ( 2.0L * ((long double)(i)) - 2.0L ) ) );
		}
		if(i==1) {
			c[i-1] = 0.0L;
		}
		else {
			c[i-1] = 4.0L * ( ((long double)(i)) - 1.0L ) * ( alpha + ( ((long double)(i)) - 1.0L ) ) * ( beta + ( ((long double)(i)) - 1.0L ) ) 
            * ( alpha + beta + ( ((long double)(i)) - 1.0L ) ) / 
            ( ( alpha + beta + ( 2.0L * ((long double)(i)) - 1.0L ) ) * (std::pow(alpha + beta + (2.0L*((long double)(i)) - 2.0L),2.0L)) 
			 * ( alpha + beta + ( 2.0L * ((long double)(i)) - 3.0L ) ) );
		}
	}
	
	delta = (gamma(alpha + 1.0L) * gamma(beta + 1.0L)) / gamma(alpha + beta + 2.0L);
	
	prod = 1.0L;
	for(i=2;i <= (*npoints);i++)
		prod = prod * c[i-1];
	cc = delta * std::pow( 2.0L, alpha + beta + 1.0L ) * prod;
	
	for(i=1;i<=(*npoints);i++) {
		if(i==1) {
			an = alpha / (long double)((*npoints));
			bn = beta / (long double)((*npoints));
			
			r1 = ( 1.0L + alpha ) * ( 2.78L / ( 4.0L + (long double)((*npoints)*(*npoints))) + 0.768L * an / (long double)((*npoints)));
			r2 = 1.0L + 1.48L * an + 0.96L * bn + 0.452L * an * an + 0.83L * an * bn;
			
			x0 = ( r2 - r1 ) / r2;
		}
		else if(i==2) {
			r1 = ( 4.1L + alpha ) / ( ( 1.0L + alpha ) * ( 1.0L + 0.156L * alpha ) );
			
			r2 = 1.0L + 0.06L * ((long double)((*npoints)) - 8.0L) * (1.0L + 0.12L * alpha) / (long double)((*npoints));
			r3 = 1.0L + 0.012L * beta * (1.0L + 0.25L * fabsl(alpha)) / (long double)((*npoints));
			
			x0 = x0 - r1*r2*r3*(1.0L - x0);
		}
		else if(i==3) {
			r1 = ( 1.67L + 0.28L * alpha ) / ( 1.0L + 0.37L * alpha );
			r2 = 1.0L + 0.22L * ( (long double)((*npoints)) - 8.0L) / (long double)((*npoints));
			r3 = 1.0L + 8.0L * beta / ( ( 6.28L + beta ) * (long double)((*npoints)*(*npoints)));
			
			x0 = x0 - r1 * r2 * r3 * ( Location[0] - x0 );
		}
		else if(i<(*npoints)-1) {
			x0 = 3.0L * Location[i-2] - 3.0L * Location[i-3] + Location[i-4];
		}
		else if(i==(*npoints)-1) {
			r1 = ( 1.0L + 0.235L * beta ) / (0.766L + 0.119L * beta);
			r2 = 1.0L / ( 1.0L + 0.639L * ((long double)((*npoints)) - 4.0L) 
						 / ( 1.0L + 0.71L * ((long double)((*npoints)) - 4.0L)));
			
			r3 = 1.0L / ( 1.0L + 20.0L * alpha / ( ( 7.5L + alpha ) * 
												  (long double)((*npoints)*(*npoints))));
			
			x0 = x0 + r1 * r2 * r3 * ( x0 - Location[i-3] );
		}
		else if(i==(*npoints)) {
			r1 = ( 1.0L + 0.37L * beta ) / ( 1.67L + 0.28L * beta );
			
			r2 = 1.0L / ( 1.0L + 0.22L * ( (long double)((*npoints)) - 8.0L ) 
						 / (long double)((*npoints)));
			
			r3 = 1.0L / ( 1.0L + 8.0L * alpha / 
						 ( ( 6.28L + alpha ) * (long double)((*npoints)*(*npoints))));
			
			x0 = x0 + r1 * r2 * r3 * ( x0 - Location[i-3] );
		}
		
		// Improving the root of the Jacobi polinomial
		long double d;
		long double precision;
		int itera, itera_max = 10;

		precision = machinePrecision();

		for(itera=1;itera<=itera_max;itera++) {
			d = JacobiPolinomial(x0,(*npoints),alpha,beta,b,c,&dp2,&p1);
			d /= dp2;
			x0 = x0 - d;
			if(fabsl(d) <= precision*(fabsl(x0) + 1.0L)) {
				break;
			}
		}
		Location[i-1] = x0;
		Weight[i-1] = cc/(dp2*p1);
	}

	// inverting the position of the points
	for(i=1;i<=(*npoints)/2;i++) {
		temp = Location[i-1];
		Location[i-1] = Location[(*npoints)-i];
		Location[(*npoints)-i] = temp;
	}
	// inverting the position of the weights
	for(i=1;i<=(*npoints)/2;i++) {
		temp = Weight[i-1];
		Weight[i-1] = Weight[(*npoints)-i];
		Weight[(*npoints)-i] = temp;
	}
}